

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O1

void __thiscall Nes_Namco::run_until(Nes_Namco *this,cpu_time_t nes_end_time)

{
  Namco_Osc *pNVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  Blip_Buffer *pBVar5;
  unsigned_long uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  buf_t_ *pbVar20;
  bool bVar21;
  
  lVar7 = (ulong)(this->reg[0x7f] >> 4 & 7) + 1;
  uVar12 = (ulong)(8 - (int)lVar7);
  lVar4 = this->last_time;
  do {
    pBVar5 = this->oscs[uVar12].output;
    if (pBVar5 != (Blip_Buffer *)0x0) {
      pNVar1 = this->oscs + uVar12;
      uVar6 = pBVar5->factor_;
      uVar10 = uVar6 * lVar4 + pBVar5->offset_ + pNVar1->delay;
      uVar16 = uVar6 * nes_end_time + pBVar5->offset_;
      pNVar1->delay = 0;
      if (uVar10 < uVar16) {
        bVar2 = (byte)(this->synth).impulses[uVar12 * 2 + -0x10];
        if ((bVar2 < 0x20) ||
           (bVar3 = *(byte *)((long)(this->synth).impulses + uVar12 * 8 + -0x3d), (bVar3 & 0xf) == 0
           )) {
          bVar21 = false;
        }
        else {
          uVar14 = (ulong)this->reg[uVar12 * 8 + 0x40] |
                   (ulong)((uint)this->reg[uVar12 * 8 + 0x42] << 8 | (bVar2 & 3) << 0x10);
          bVar21 = uVar14 != 0;
          if (bVar21) {
            iVar18 = (int)pNVar1->last_amp;
            iVar9 = (int)pNVar1->wave_pos;
            do {
              iVar8 = (uint)*(byte *)((long)(this->synth).impulses + uVar12 * 8 + -0x3e) + iVar9;
              iVar13 = (this->reg[iVar8 >> 1] >> ((char)iVar8 * '\x04' & 4U) & 0xf) * (bVar3 & 0xf);
              iVar8 = iVar13 - iVar18;
              if (iVar8 != 0) {
                uVar19 = (uint)(uVar10 >> 0x10) & 0xfffffffe;
                if (pBVar5->buffer_size_ <= uVar19) {
                  __assert_fail("( \"Blip_Synth/Blip_wave: Went past end of buffer\", sample_index < blip_buf->buffer_size_ )"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Synth.h"
                                ,0x8e,
                                "void Blip_Synth<3, 15>::offset_resampled(blip_resampled_time_t, int, Blip_Buffer *) const [quality = 3, range = 15]"
                               );
                }
                pbVar20 = pBVar5->buffer_ + (uVar19 + 6);
                piVar11 = (int *)((long)(this->synth).impulses +
                                 (ulong)(((uint)(uVar10 >> 8) & 0x1f8) * 3));
                iVar15 = (this->synth).impulse.offset * iVar8;
                iVar17 = -3;
                do {
                  iVar18 = piVar11[1];
                  *(int *)pbVar20 = *piVar11 * iVar8 + (*(int *)pbVar20 - iVar15);
                  *(int *)(pbVar20 + 2) = iVar18 * iVar8 + (*(int *)(pbVar20 + 2) - iVar15);
                  pbVar20 = pbVar20 + 4;
                  piVar11 = piVar11 + 2;
                  iVar17 = iVar17 + 1;
                  iVar18 = iVar13;
                } while (iVar17 != 0);
              }
              iVar9 = iVar9 + 1;
              uVar10 = uVar10 + ((uVar6 * 0xf0000) / uVar14) * lVar7;
              if ((int)(uint)(byte)(0x20 - (bVar2 & 0x1c)) <= iVar9) {
                iVar9 = 0;
              }
            } while (uVar10 < uVar16);
            pNVar1->wave_pos = (short)iVar9;
            pNVar1->last_amp = (short)iVar18;
            bVar21 = true;
          }
        }
        if (!bVar21) goto LAB_001140ed;
      }
      pNVar1->delay = uVar10 - uVar16;
    }
LAB_001140ed:
    uVar12 = uVar12 + 1;
    if ((int)uVar12 == 8) {
      this->last_time = nes_end_time;
      return;
    }
  } while( true );
}

Assistant:

void Nes_Namco::run_until( cpu_time_t nes_end_time )
{
	int active_oscs = ((reg [0x7f] >> 4) & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		
		Blip_Buffer::resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		Blip_Buffer::resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xe0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( !freq )
				continue;
			Blip_Buffer::resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = (8 - ((osc_reg [4] >> 2) & 7)) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1];
				wave_pos++;
				if ( addr & 1 )
					sample >>= 4;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}